

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  ostream *this_00;
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  char *pcVar5;
  stringstream out;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1e8,this,opt,1);
  this_00 = local_198;
  ::std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)local_1e8,local_1e0);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (opt->expected_max_ < 0x20000000) {
    if (opt->expected_max_ < 2) goto LAB_001102ce;
    ::std::__ostream_insert<char,std::char_traits<char>>(this_00,"(",1);
    this_00 = (ostream *)::std::ostream::operator<<((ostream *)this_00,opt->expected_min_);
    lVar4 = 2;
    pcVar5 = "x)";
  }
  else {
    lVar4 = 3;
    pcVar5 = "...";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar5,lVar4);
LAB_001102ce:
  if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    plVar1 = (long *)::std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x131117);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_1d8 = *plVar2;
      lStack_1d0 = plVar1[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar2;
      local_1e8 = (long *)*plVar1;
    }
    local_1e0 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_1e8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar3) {
      lVar4 = plVar1[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);
    if(opt->get_expected_max() >= detail::expected_max_vector_size)
        out << "...";
    else if(opt->get_expected_max() > 1)
        out << "(" << opt->get_expected() << "x)";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}